

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O3

string * __thiscall Message::diggest_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1b8;
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_188,(this->o)._M_dataplus._M_p,(this->o)._M_string_length);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::ostream::operator<<((ostream *)poVar1,this->c);
  std::__cxx11::stringbuf::str();
  sha256(__return_storage_ptr__,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::diggest() {
    std::stringstream ss;
    ss << o << t << c;
    return sha256(ss.str());
}